

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

Variant * Jinx::Impl::IsEmpty(Variant *__return_storage_ptr__,ScriptPtr *param_1,Parameters *params)

{
  ValueType VVar1;
  Variant *this;
  String local_30;
  
  this = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
         super__Vector_impl_data._M_start;
  VVar1 = this->m_type;
  if (VVar1 == String) {
    Jinx::Variant::GetString_abi_cxx11_(&local_30,this);
    Jinx::Variant::Variant(__return_storage_ptr__,local_30._M_string_length == 0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_30);
  }
  else {
    if (VVar1 == Buffer) {
      Jinx::Variant::GetBuffer((Variant *)&local_30);
      Jinx::Variant::Variant(__return_storage_ptr__,*(long *)(local_30._M_dataplus._M_p + 8) == 0);
    }
    else {
      if (VVar1 != Collection) {
        __return_storage_ptr__->m_type = Null;
        Jinx::Variant::SetNull(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      Jinx::Variant::GetCollection((Variant *)&local_30);
      Jinx::Variant::Variant
                (__return_storage_ptr__,*(long *)(local_30._M_dataplus._M_p + 0x28) == 0);
    }
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Variant IsEmpty(ScriptPtr, const Parameters & params)
	{
		switch (params[0].GetType())
		{
		case ValueType::Collection:
			return params[0].GetCollection()->empty();
		case ValueType::String:
			return params[0].GetString().empty();
		case ValueType::Buffer:
			return params[0].GetBuffer()->Size() == 0;
		default:
			break;
		}
		return nullptr;
	}